

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

Cord * __thiscall absl::lts_20240722::Cord::operator=(Cord *this,string_view src)

{
  Nullable<absl::cord_internal::CordRep_*> this_00;
  CordzInfo *pCVar1;
  CordRepFlat *pCVar2;
  size_t sVar3;
  Nullable<CordRep_*> pCVar4;
  Nullable<const_char_*> data;
  size_t alloc_hint;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t alloc_hint_00;
  ulong length;
  CordzUpdateScope scope;
  
  data = src._M_str;
  length = src._M_len;
  this_00 = InlineRep::tree(&this->contents_);
  if (length < 0x10) {
    if (this_00 != (Nullable<absl::cord_internal::CordRep_*>)0x0) {
      pCVar1 = cord_internal::InlineData::cordz_info((InlineData *)this);
      if (pCVar1 != (CordzInfo *)0x0) {
        absl::lts_20240722::cord_internal::CordzInfo::Untrack();
      }
      cord_internal::InlineData::set_inline_data((InlineData *)this,data,length);
      cord_internal::CordRep::Unref(this_00);
      return this;
    }
    cord_internal::InlineData::set_inline_data((InlineData *)this,data,length);
    return this;
  }
  if (this_00 == (Nullable<absl::cord_internal::CordRep_*>)0x0) {
    pCVar4 = NewTree(data,length,alloc_hint);
    InlineRep::EmplaceTree(&this->contents_,pCVar4,kAssignString);
    return this;
  }
  pCVar1 = cord_internal::InlineData::cordz_info((InlineData *)this);
  cord_internal::CordzUpdateScope::CordzUpdateScope(&scope,pCVar1,kAssignString);
  alloc_hint_00 = extraout_RDX;
  if (5 < this_00->tag) {
    pCVar2 = cord_internal::CordRep::flat(this_00);
    sVar3 = cord_internal::CordRepFlat::Capacity(pCVar2);
    alloc_hint_00 = extraout_RDX_00;
    if ((length <= sVar3) && ((this_00->refcount).count_.super___atomic_base<int>._M_i == 2)) {
      pCVar2 = cord_internal::CordRep::flat(this_00);
      memmove((pCVar2->super_CordRep).storage,data,length);
      this_00->length = length;
      VerifyTree(this_00);
      goto LAB_0011167b;
    }
  }
  pCVar4 = NewTree(data,length,alloc_hint_00);
  InlineRep::SetTree(&this->contents_,pCVar4,&scope);
  cord_internal::CordRep::Unref(this_00);
LAB_0011167b:
  cord_internal::CordzUpdateScope::~CordzUpdateScope(&scope);
  return this;
}

Assistant:

Cord& Cord::operator=(absl::string_view src) {
  auto constexpr method = CordzUpdateTracker::kAssignString;
  const char* data = src.data();
  size_t length = src.size();
  CordRep* tree = contents_.tree();
  if (length <= InlineRep::kMaxInline) {
    // Embed into this->contents_, which is somewhat subtle:
    // - MaybeUntrackCord must be called before Unref(tree).
    // - MaybeUntrackCord must be called before set_data() clobbers cordz_info.
    // - set_data() must be called before Unref(tree) as it may reference tree.
    if (tree != nullptr) CordzInfo::MaybeUntrackCord(contents_.cordz_info());
    contents_.set_data(data, length);
    if (tree != nullptr) CordRep::Unref(tree);
    return *this;
  }
  if (tree != nullptr) {
    CordzUpdateScope scope(contents_.cordz_info(), method);
    if (tree->IsFlat() && tree->flat()->Capacity() >= length &&
        tree->refcount.IsOne()) {
      // Copy in place if the existing FLAT node is reusable.
      memmove(tree->flat()->Data(), data, length);
      tree->length = length;
      VerifyTree(tree);
      return *this;
    }
    contents_.SetTree(NewTree(data, length, 0), scope);
    CordRep::Unref(tree);
  } else {
    contents_.EmplaceTree(NewTree(data, length, 0), method);
  }
  return *this;
}